

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::restoreInitialBasis(SPxBasisBase<double> *this)

{
  long *plVar1;
  Verbosity VVar2;
  Representation RVar3;
  int iVar4;
  SPxStatus SVar5;
  Status SVar6;
  int iVar7;
  int iVar8;
  Status *pSVar9;
  SPxId *pSVar10;
  SPxLPBase<double> *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Verbosity old_verbosity;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Status in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  SPxStatus in_stack_ffffffffffffffbc;
  Status in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  DataKey in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar11;
  undefined4 in_stack_ffffffffffffffdc;
  SPxStatus local_20;
  DataKey local_1c;
  int local_14;
  undefined4 local_10;
  Verbosity local_c [3];
  
  if ((*(long *)&(in_RDI->super_LPColSetBase<double>).super_SVSetBase<double>.list.
                 super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements != 0) &&
     (VVar2 = SPxOut::getVerbosity
                        (*(SPxOut **)
                          &(in_RDI->super_LPColSetBase<double>).super_SVSetBase<double>.list.
                           super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements),
     4 < (int)VVar2)) {
    local_c[0] = SPxOut::getVerbosity
                           (*(SPxOut **)
                             &(in_RDI->super_LPColSetBase<double>).super_SVSetBase<double>.list.
                              super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements);
    plVar1 = *(long **)&(in_RDI->super_LPColSetBase<double>).super_SVSetBase<double>.list.
                        super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements;
    local_10 = 5;
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_10);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    plVar1 = *(long **)&(in_RDI->super_LPColSetBase<double>).super_SVSetBase<double>.list.
                        super_IsList<soplex::SVSetBase<double>::DLPSV>.destroyElements;
    (**(code **)(*plVar1 + 0x10))(plVar1,local_c);
  }
  RVar3 = SPxSolverBase<double>::rep
                    (*(SPxSolverBase<double> **)
                      &(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
                       super_ClassArray<soplex::Nonzero<double>_>.thesize);
  if (RVar3 == COLUMN) {
    local_14 = 0;
    while (in_stack_ffffffffffffffc4 = local_14,
          iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2701c8),
          in_stack_ffffffffffffffc4 < iVar4) {
      in_stack_ffffffffffffffc0 =
           dualRowStatus((SPxBasisBase<double> *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0.idx);
      pSVar9 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               ,in_stack_ffffffffffffffac);
      *pSVar9 = in_stack_ffffffffffffffc0;
      local_1c = (DataKey)SPxLPBase<double>::rId
                                    ((SPxLPBase<double> *)
                                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                     in_stack_ffffffffffffffb4);
      pSVar10 = baseId((SPxBasisBase<double> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
      SPxId::operator=(pSVar10,(SPxRowId *)&local_1c);
      local_14 = local_14 + 1;
    }
    local_20 = REGULAR;
    while (in_stack_ffffffffffffffbc = local_20,
          SVar5 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x270262),
          in_stack_ffffffffffffffbc < SVar5) {
      SVar6 = primalColStatus<double>(in_stack_ffffffffffffffd0.info,in_RDI);
      pSVar9 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                               ,in_stack_ffffffffffffffac);
      *pSVar9 = SVar6;
      local_20 = local_20 + DUAL;
    }
  }
  else {
    iVar4 = 0;
    while (iVar11 = iVar4, iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2702cd),
          iVar4 < iVar7) {
      in_stack_ffffffffffffffb0 =
           dualRowStatus((SPxBasisBase<double> *)CONCAT44(iVar11,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0.idx);
      pSVar9 = Desc::rowStatus((Desc *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac);
      *pSVar9 = in_stack_ffffffffffffffb0;
      iVar4 = iVar11 + 1;
    }
    iVar11 = 0;
    while (iVar7 = iVar11, iVar8 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27032f),
          iVar11 < iVar8) {
      SVar6 = primalColStatus<double>(in_stack_ffffffffffffffd0.info,in_RDI);
      pSVar9 = Desc::colStatus((Desc *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),iVar11);
      *pSVar9 = SVar6;
      in_stack_ffffffffffffffd0 =
           (DataKey)SPxLPBase<double>::cId
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),iVar4);
      pSVar10 = baseId((SPxBasisBase<double> *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),iVar11);
      SPxId::operator=(pSVar10,(SPxColId *)&stack0xffffffffffffffd0);
      iVar11 = iVar7 + 1;
    }
  }
  SVar5 = status((SPxBasisBase<double> *)in_RDI);
  if ((NO_PROBLEM < SVar5) &&
     (((ulong)(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.list.
              super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first & 1) != 0)) {
    loadMatrixVecs((SPxBasisBase<double> *)in_stack_ffffffffffffffd0);
  }
  setStatus((SPxBasisBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void SPxBasisBase<R>::restoreInitialBasis()
{
   assert(!factorized);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ICHBAS10 setup slack basis" << std::endl;)

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(int i = 0; i < theLP->nRows(); ++i)
      {
         thedesc.rowStatus(i) = dualRowStatus(i);
         baseId(i) = theLP->SPxLPBase<R>::rId(i);
      }

      for(int i = 0; i < theLP->nCols(); ++i)
         thedesc.colStatus(i) = primalColStatus(i, theLP);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);

      for(int i = 0; i < theLP->nRows(); ++i)
         thedesc.rowStatus(i) = dualRowStatus(i);

      for(int i = 0; i < theLP->nCols(); ++i)
      {
         thedesc.colStatus(i) = primalColStatus(i, theLP);
         baseId(i) = theLP->SPxLPBase<R>::cId(i);
      }
   }

   /* if matrix was set up, load new basis vectors to the matrix */
   if(status() > NO_PROBLEM && matrixIsSetup)
      loadMatrixVecs();

   /* update basis status */
   setStatus(REGULAR);
}